

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O0

void __thiscall
WavingSketch<8U,_16U,_4U>::Init(WavingSketch<8U,_16U,_4U> *this,Data<4U> *from,Data<4U> *to)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  Data<4U> *in_RDX;
  Data<4U> *in_RSI;
  undefined8 *in_RDI;
  uint position;
  uint i;
  bool init;
  Stream<4U> stream;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  uint local_28;
  Stream<4U> local_20 [2];
  Data<4U> *local_10;
  
  local_10 = in_RSI;
  Stream<4U>::Stream(local_20,in_RSI,in_RDX);
  bVar1 = true;
  for (local_28 = 0; local_28 < *(uint *)((long)in_RDI + 0x7c); local_28 = local_28 + 1) {
    uVar3 = Stream<4U>::Hash((Stream<4U> *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             (uint)((ulong)in_RDI >> 0x20));
    in_stack_ffffffffffffffd4 = uVar3 % *(uint *)(in_RDI + 0x10);
    bVar2 = BitSet::Get((BitSet *)in_RDI[0x11],in_stack_ffffffffffffffd4);
    if (!bVar2) {
      bVar1 = false;
      BitSet::Set((BitSet *)in_RDI[0x11],in_stack_ffffffffffffffd4);
    }
  }
  if (!bVar1) {
    (**(code **)*in_RDI)(in_RDI,local_10);
  }
  return;
}

Assistant:

void Init(const Data<DATA_LEN>& from, const Data<DATA_LEN>& to) {
		Stream<DATA_LEN> stream(from, to);

		bool init = true;
		for (uint i = 0; i < HASH_NUM; ++i) {
			uint position = stream.Hash(i) % LENGTH;
			if (!bitset->Get(position)) {
				init = false;
				bitset->Set(position);
			}
		}

		if (!init) Init(from);
	}